

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

void __thiscall QGraphicsWidgetPrivate::ensureWindowData(QGraphicsWidgetPrivate *this)

{
  long lVar1;
  bool bVar2;
  unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
  *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
  *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                      *)0xa56471);
  if (!bVar2) {
    std::make_unique<QGraphicsWidgetPrivate::WindowData>();
    std::
    unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
    ::operator=(in_RDI,in_stack_ffffffffffffffd8);
    std::
    unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
    ::~unique_ptr(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::ensureWindowData()
{
    if (!windowData)
        windowData = std::make_unique<WindowData>();
}